

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O3

void __thiscall classSHA256::processChunk(classSHA256 *this)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  uint uVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  uint32_t _temp_1;
  uint uVar38;
  long lVar39;
  uint uVar40;
  int iVar41;
  uint uVar42;
  uint32_t _temp;
  uint32_t uVar43;
  uint uVar44;
  uint32_t uVar45;
  uint uVar46;
  uint32_t uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint32_t _temp_3;
  uint32_t _temp_4;
  uint uVar51;
  uint32_t uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  lVar39 = 0;
  do {
    auVar53 = *(undefined1 (*) [16])((this->state).w + lVar39);
    auVar54[1] = 0;
    auVar54[0] = auVar53[8];
    auVar54[2] = auVar53[9];
    auVar54[3] = 0;
    auVar54[4] = auVar53[10];
    auVar54[5] = 0;
    auVar54[6] = auVar53[0xb];
    auVar54[7] = 0;
    auVar54[8] = auVar53[0xc];
    auVar54[9] = 0;
    auVar54[10] = auVar53[0xd];
    auVar54[0xb] = 0;
    auVar54[0xc] = auVar53[0xe];
    auVar54[0xd] = 0;
    auVar54[0xe] = auVar53[0xf];
    auVar54[0xf] = 0;
    auVar54 = pshuflw(auVar54,auVar54,0x1b);
    auVar54 = pshufhw(auVar54,auVar54,0x1b);
    auVar28[0xd] = 0;
    auVar28._0_13_ = auVar53._0_13_;
    auVar28[0xe] = auVar53[7];
    auVar29[0xc] = auVar53[6];
    auVar29._0_12_ = auVar53._0_12_;
    auVar29._13_2_ = auVar28._13_2_;
    auVar30[0xb] = 0;
    auVar30._0_11_ = auVar53._0_11_;
    auVar30._12_3_ = auVar29._12_3_;
    auVar31[10] = auVar53[5];
    auVar31._0_10_ = auVar53._0_10_;
    auVar31._11_4_ = auVar30._11_4_;
    auVar32[9] = 0;
    auVar32._0_9_ = auVar53._0_9_;
    auVar32._10_5_ = auVar31._10_5_;
    auVar33[8] = auVar53[4];
    auVar33._0_8_ = auVar53._0_8_;
    auVar33._9_6_ = auVar32._9_6_;
    auVar35._7_8_ = 0;
    auVar35._0_7_ = auVar33._8_7_;
    auVar36._1_8_ = SUB158(auVar35 << 0x40,7);
    auVar36[0] = auVar53[3];
    auVar36._9_6_ = 0;
    auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
    auVar37[0] = auVar53[2];
    auVar37._11_4_ = 0;
    auVar34[2] = auVar53[1];
    auVar34._0_2_ = auVar53._0_2_;
    auVar34._3_12_ = SUB1512(auVar37 << 0x20,3);
    auVar53._0_2_ = auVar53._0_2_ & 0xff;
    auVar53._2_13_ = auVar34._2_13_;
    auVar53[0xf] = 0;
    auVar53 = pshuflw(auVar53,auVar53,0x1b);
    auVar53 = pshufhw(auVar53,auVar53,0x1b);
    sVar11 = auVar53._0_2_;
    sVar12 = auVar53._2_2_;
    sVar13 = auVar53._4_2_;
    sVar14 = auVar53._6_2_;
    sVar15 = auVar53._8_2_;
    sVar16 = auVar53._10_2_;
    sVar17 = auVar53._12_2_;
    sVar18 = auVar53._14_2_;
    sVar19 = auVar54._0_2_;
    sVar20 = auVar54._2_2_;
    sVar21 = auVar54._4_2_;
    sVar22 = auVar54._6_2_;
    sVar23 = auVar54._8_2_;
    sVar24 = auVar54._10_2_;
    sVar25 = auVar54._12_2_;
    sVar26 = auVar54._14_2_;
    puVar1 = (this->state).w + lVar39;
    *(char *)puVar1 = (0 < sVar11) * (sVar11 < 0x100) * auVar53[0] - (0xff < sVar11);
    *(char *)((long)puVar1 + 1) = (0 < sVar12) * (sVar12 < 0x100) * auVar53[2] - (0xff < sVar12);
    *(char *)((long)puVar1 + 2) = (0 < sVar13) * (sVar13 < 0x100) * auVar53[4] - (0xff < sVar13);
    *(char *)((long)puVar1 + 3) = (0 < sVar14) * (sVar14 < 0x100) * auVar53[6] - (0xff < sVar14);
    *(char *)(puVar1 + 1) = (0 < sVar15) * (sVar15 < 0x100) * auVar53[8] - (0xff < sVar15);
    *(char *)((long)puVar1 + 5) = (0 < sVar16) * (sVar16 < 0x100) * auVar53[10] - (0xff < sVar16);
    *(char *)((long)puVar1 + 6) = (0 < sVar17) * (sVar17 < 0x100) * auVar53[0xc] - (0xff < sVar17);
    *(char *)((long)puVar1 + 7) = (0 < sVar18) * (sVar18 < 0x100) * auVar53[0xe] - (0xff < sVar18);
    *(char *)(puVar1 + 2) = (0 < sVar19) * (sVar19 < 0x100) * auVar54[0] - (0xff < sVar19);
    *(char *)((long)puVar1 + 9) = (0 < sVar20) * (sVar20 < 0x100) * auVar54[2] - (0xff < sVar20);
    *(char *)((long)puVar1 + 10) = (0 < sVar21) * (sVar21 < 0x100) * auVar54[4] - (0xff < sVar21);
    *(char *)((long)puVar1 + 0xb) = (0 < sVar22) * (sVar22 < 0x100) * auVar54[6] - (0xff < sVar22);
    *(char *)(puVar1 + 3) = (0 < sVar23) * (sVar23 < 0x100) * auVar54[8] - (0xff < sVar23);
    *(char *)((long)puVar1 + 0xd) = (0 < sVar24) * (sVar24 < 0x100) * auVar54[10] - (0xff < sVar24);
    *(char *)((long)puVar1 + 0xe) = (0 < sVar25) * (sVar25 < 0x100) * auVar54[0xc] - (0xff < sVar25)
    ;
    *(char *)((long)puVar1 + 0xf) = (0 < sVar26) * (sVar26 < 0x100) * auVar54[0xe] - (0xff < sVar26)
    ;
    lVar39 = lVar39 + 4;
  } while (lVar39 != 0x10);
  uVar2 = (this->state).h[0];
  uVar3 = (this->state).h[1];
  uVar4 = (this->state).h[2];
  uVar5 = (this->state).h[3];
  uVar6 = (this->state).h[4];
  uVar7 = (this->state).h[5];
  uVar8 = (this->state).h[6];
  uVar9 = (this->state).h[7];
  lVar39 = 0;
  uVar45 = uVar2;
  uVar44 = uVar3;
  uVar38 = uVar4;
  uVar49 = uVar5;
  uVar52 = uVar6;
  uVar51 = uVar7;
  uVar43 = uVar8;
  uVar47 = uVar9;
  do {
    uVar48 = uVar43;
    uVar43 = uVar51;
    uVar51 = uVar52;
    uVar50 = uVar38;
    uVar38 = uVar44;
    uVar44 = uVar45;
    iVar41 = ((uVar43 ^ uVar48) & uVar51 ^ uVar48) + uVar47 +
             ((uVar51 << 7 | uVar51 >> 0x19) ^
             (uVar51 << 0x15 | uVar51 >> 0xb) ^ (uVar51 << 0x1a | uVar51 >> 6)) +
             *(int *)((long)processChunk::k + lVar39) + *(int *)((long)(this->state).w + lVar39);
    uVar52 = uVar49 + iVar41;
    uVar45 = (uVar38 & uVar50 ^ (uVar38 ^ uVar50) & uVar44) +
             ((uVar44 << 10 | uVar44 >> 0x16) ^
             (uVar44 << 0x13 | uVar44 >> 0xd) ^ (uVar44 << 0x1e | uVar44 >> 2)) + iVar41;
    lVar39 = lVar39 + 4;
    uVar49 = uVar50;
    uVar47 = uVar48;
  } while (lVar39 != 0x40);
  lVar39 = 0x1e;
  do {
    uVar46 = uVar43;
    uVar43 = uVar51;
    uVar51 = uVar52;
    uVar40 = uVar38;
    uVar38 = uVar44;
    uVar44 = uVar45;
    uVar27 = (uint)lVar39;
    uVar49 = (this->state).w[uVar27 - 0xd & 0xf];
    uVar10 = (this->state).w[uVar27 & 0xf];
    uVar42 = uVar27 - 0xe & 0xf;
    uVar45 = (uVar10 >> 10 ^ (uVar10 << 0xd | uVar10 >> 0x13) ^ (uVar10 << 0xf | uVar10 >> 0x11)) +
             (this->state).w[uVar27 - 5 & 0xf] + (this->state).w[uVar42] +
             (uVar49 >> 3 ^ (uVar49 << 0xe | uVar49 >> 0x12) ^ (uVar49 << 0x19 | uVar49 >> 7));
    (this->state).w[uVar42] = uVar45;
    iVar41 = ((uVar43 ^ uVar46) & uVar51 ^ uVar46) + uVar48 +
             ((uVar51 << 7 | uVar51 >> 0x19) ^
             (uVar51 << 0x15 | uVar51 >> 0xb) ^ (uVar51 << 0x1a | uVar51 >> 6)) +
             *(int *)(&UNK_001f2468 + lVar39 * 4) + uVar45;
    uVar52 = uVar50 + iVar41;
    uVar45 = (uVar38 & uVar40 ^ (uVar38 ^ uVar40) & uVar44) +
             ((uVar44 << 10 | uVar44 >> 0x16) ^
             (uVar44 << 0x13 | uVar44 >> 0xd) ^ (uVar44 << 0x1e | uVar44 >> 2)) + iVar41;
    lVar39 = lVar39 + 1;
    uVar50 = uVar40;
    uVar48 = uVar46;
  } while (lVar39 != 0x4e);
  (this->state).h[0] = uVar45 + uVar2;
  (this->state).h[1] = uVar44 + uVar3;
  (this->state).h[2] = uVar38 + uVar4;
  (this->state).h[3] = uVar40 + uVar5;
  (this->state).h[4] = uVar52 + uVar6;
  (this->state).h[5] = uVar51 + uVar7;
  (this->state).h[6] = uVar43 + uVar8;
  (this->state).h[7] = uVar46 + uVar9;
  return;
}

Assistant:

void classSHA256::processChunk()
{
    // Round constants for SHA-256.
    static uint32_t const k[64] PROGMEM = {
        0x428a2f98, 0x71374491, 0xb5c0fbcf, 0xe9b5dba5,
        0x3956c25b, 0x59f111f1, 0x923f82a4, 0xab1c5ed5,
        0xd807aa98, 0x12835b01, 0x243185be, 0x550c7dc3,
        0x72be5d74, 0x80deb1fe, 0x9bdc06a7, 0xc19bf174,
        0xe49b69c1, 0xefbe4786, 0x0fc19dc6, 0x240ca1cc,
        0x2de92c6f, 0x4a7484aa, 0x5cb0a9dc, 0x76f988da,
        0x983e5152, 0xa831c66d, 0xb00327c8, 0xbf597fc7,
        0xc6e00bf3, 0xd5a79147, 0x06ca6351, 0x14292967,
        0x27b70a85, 0x2e1b2138, 0x4d2c6dfc, 0x53380d13,
        0x650a7354, 0x766a0abb, 0x81c2c92e, 0x92722c85,
        0xa2bfe8a1, 0xa81a664b, 0xc24b8b70, 0xc76c51a3,
        0xd192e819, 0xd6990624, 0xf40e3585, 0x106aa070,
        0x19a4c116, 0x1e376c08, 0x2748774c, 0x34b0bcb5,
        0x391c0cb3, 0x4ed8aa4a, 0x5b9cca4f, 0x682e6ff3,
        0x748f82ee, 0x78a5636f, 0x84c87814, 0x8cc70208,
        0x90befffa, 0xa4506ceb, 0xbef9a3f7, 0xc67178f2
    };

    // Convert the first 16 words from big endian to host byte order.
    uint8_t index;
    for (index = 0; index < 16; ++index)
        state.w[index] = be32toh(state.w[index]);

    // Initialise working variables to the current hash value.
    uint32_t a = state.h[0];
    uint32_t b = state.h[1];
    uint32_t c = state.h[2];
    uint32_t d = state.h[3];
    uint32_t e = state.h[4];
    uint32_t f = state.h[5];
    uint32_t g = state.h[6];
    uint32_t h = state.h[7];

    // Perform the first 16 rounds of the compression function main loop.
    uint32_t temp1, temp2;
    for (index = 0; index < 16; ++index) {
        temp1 = h + pgm_read_dword(k + index) + state.w[index] +
                (rightRotate6(e) ^ rightRotate11(e) ^ rightRotate25(e)) +
                ((e & f) ^ ((~e) & g));
        temp2 = (rightRotate2(a) ^ rightRotate13(a) ^ rightRotate22(a)) +
                ((a & b) ^ (a & c) ^ (b & c));
        h = g;
        g = f;
        f = e;
        e = d + temp1;
        d = c;
        c = b;
        b = a;
        a = temp1 + temp2;
    }

    // Perform the 48 remaining rounds.  We expand the first 16 words to
    // 64 in-place in the "w" array.  This saves 192 bytes of memory
    // that would have otherwise need to be allocated to the "w" array.
    for (; index < 64; ++index) {
        // Expand the next word.
        temp1 = state.w[(index - 15) & 0x0F];
        temp2 = state.w[(index - 2) & 0x0F];
        temp1 = state.w[index & 0x0F] =
            state.w[(index - 16) & 0x0F] + state.w[(index - 7) & 0x0F] +
                (rightRotate7(temp1) ^ rightRotate18(temp1) ^ (temp1 >> 3)) +
                (rightRotate17(temp2) ^ rightRotate19(temp2) ^ (temp2 >> 10));

        // Perform the round.
        temp1 = h + pgm_read_dword(k + index) + temp1 +
                (rightRotate6(e) ^ rightRotate11(e) ^ rightRotate25(e)) +
                ((e & f) ^ ((~e) & g));
        temp2 = (rightRotate2(a) ^ rightRotate13(a) ^ rightRotate22(a)) +
                ((a & b) ^ (a & c) ^ (b & c));
        h = g;
        g = f;
        f = e;
        e = d + temp1;
        d = c;
        c = b;
        b = a;
        a = temp1 + temp2;
    }

    // Add the compressed chunk to the current hash value.
    state.h[0] += a;
    state.h[1] += b;
    state.h[2] += c;
    state.h[3] += d;
    state.h[4] += e;
    state.h[5] += f;
    state.h[6] += g;
    state.h[7] += h;

    // Attempt to clean up the stack.
    a = b = c = d = e = f = g = h = temp1 = temp2 = 0;
}